

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markable.hpp
# Opt level: O0

void __thiscall
ak_toolkit::markable_ns::dual_storage<mark_range2>::change_to_value
          (dual_storage<mark_range2> *this,value_type *v)

{
  value_type *v_local;
  dual_storage<mark_range2> *this_local;
  
  destroy_storage(this);
  construct_value(this,v);
  return;
}

Assistant:

void change_to_value(value_type&& v)
    try {
      destroy_storage();
      construct_value(std::move(v));
    }
    catch (...)
    { // now, neither value nor no-value. We have to try to assign no-value
      construct_storage_checked();
      throw;
    }